

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_vector.c
# Opt level: O3

exr_result_t
exr_attr_string_vector_init_entry
          (exr_context_t ctxt,exr_attr_string_vector_t *sv,int32_t idx,int32_t len)

{
  ulong uVar1;
  exr_result_t eVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  uVar1 = (ulong)(uint)idx;
  if (sv != (exr_attr_string_vector_t *)0x0) {
    if (-1 < idx && idx < sv->n_strings) {
      eVar2 = exr_attr_string_init(ctxt,sv->strings + uVar1,len);
      return eVar2;
    }
    eVar2 = (*ctxt->print_error)
                      (ctxt,3,"Invalid index (%d of %d) initializing string vector",uVar1,
                       (ulong)(uint)sv->n_strings,ctxt->print_error);
    return eVar2;
  }
  eVar2 = (*ctxt->print_error)
                    (ctxt,3,"Invalid reference to string vector object to initialize index %d",uVar1
                     ,ctxt->print_error);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_string_vector_init_entry (
    exr_context_t ctxt, exr_attr_string_vector_t* sv, int32_t idx, int32_t len)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (sv)
    {
        if (idx < 0 || idx >= sv->n_strings)
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid index (%d of %d) initializing string vector",
                idx,
                sv->n_strings);

        return exr_attr_string_init (
            ctxt, EXR_CONST_CAST (exr_attr_string_t*, sv->strings + idx), len);
    }

    return ctxt->print_error (
        ctxt,
        EXR_ERR_INVALID_ARGUMENT,
        "Invalid reference to string vector object to initialize index %d",
        idx);
}